

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void ErrorMsg(char *filename,int lineno,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  va_list ap;
  char *format_local;
  int lineno_local;
  char *filename_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  ap[0].reg_save_area = format;
  if (lineno < 1) {
    fprintf(_stderr,"%s: ",filename);
  }
  else {
    fprintf(_stderr,"%s:%d: ",filename,(ulong)(uint)lineno);
  }
  ap[0].overflow_arg_area = local_e8;
  ap[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  vfprintf(_stderr,(char *)ap[0].reg_save_area,&local_38);
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void ErrorMsg(const char *filename, int lineno, const char *format, ...){
  va_list ap;

#if _MSC_VER
  if( lineno>0 ){
    fprintf(stderr,"%s(%d) : error : ",filename,lineno);
  }else{
    fprintf(stderr,"%s : error : ",filename);
  }
#else
  if( lineno>0 ){
    fprintf(stderr,"%s:%d: ",filename,lineno);
  }else{
    fprintf(stderr,"%s: ",filename);
  }
#endif
  va_start(ap, format);
  vfprintf(stderr,format,ap);
  va_end(ap);
  fprintf(stderr, "\n");
}